

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

Reader * __thiscall
capnp::MessageReader::getRootInternal(Reader *__return_storage_ptr__,MessageReader *this)

{
  PointerReader reader;
  ReaderArena *pRVar1;
  SegmentReader *this_00;
  word *pwVar2;
  bool local_79;
  PointerReader local_60;
  Fault local_30;
  Fault f;
  SegmentReader *segment;
  MessageReader *local_10;
  MessageReader *this_local;
  
  local_10 = this;
  if ((this->allocatedArena & 1U) == 0) {
    pRVar1 = arena(this);
    segment = (SegmentReader *)this;
    kj::ctor<capnp::_::ReaderArena,capnp::MessageReader*>(pRVar1,(MessageReader **)&segment);
    this->allocatedArena = true;
  }
  pRVar1 = arena(this);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id
            ((Id<unsigned_int,_capnp::_::Segment> *)((long)&f.exception + 4),0);
  this_00 = _::ReaderArena::tryGetSegment(pRVar1,f.exception._4_4_);
  local_79 = false;
  if (this_00 != (SegmentReader *)0x0) {
    pwVar2 = _::SegmentReader::getStartPtr(this_00);
    local_79 = _::SegmentReader::checkObject(this_00,pwVar2,1);
  }
  if (local_79 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0x60,FAILED,
               "segment != nullptr && segment->checkObject(segment->getStartPtr(), ONE * WORDS)",
               "\"Message did not contain a root pointer.\"",
               (char (*) [40])"Message did not contain a root pointer.");
    (__return_storage_ptr__->reader).pointer = (WirePointer *)0x0;
    *(undefined8 *)&(__return_storage_ptr__->reader).nestingLimit = 0;
    (__return_storage_ptr__->reader).segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->reader).capTable = (CapTableReader *)0x0;
    AnyPointer::Reader::Reader(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  else {
    pwVar2 = _::SegmentReader::getStartPtr(this_00);
    _::PointerReader::getRoot
              (&local_60,this_00,(CapTableReader *)&(anonymous_namespace)::dummyCapTableReader,
               pwVar2,(this->options).nestingLimit);
    reader.capTable = local_60.capTable;
    reader.segment = local_60.segment;
    reader.pointer = local_60.pointer;
    reader.nestingLimit = local_60.nestingLimit;
    reader._28_4_ = local_60._28_4_;
    AnyPointer::Reader::Reader(__return_storage_ptr__,reader);
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Reader MessageReader::getRootInternal() {
  if (!allocatedArena) {
    static_assert(sizeof(_::ReaderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a ReaderArena.  Please increase it.  This will break "
        "ABI compatibility.");
    kj::ctor(*arena(), this);
    allocatedArena = true;
  }

  _::SegmentReader* segment = arena()->tryGetSegment(_::SegmentId(0));
  KJ_REQUIRE(segment != nullptr &&
             segment->checkObject(segment->getStartPtr(), ONE * WORDS),
             "Message did not contain a root pointer.") {
    return AnyPointer::Reader();
  }

  // const_cast here is safe because dummyCapTableReader has no state.
  return AnyPointer::Reader(_::PointerReader::getRoot(
      segment, const_cast<DummyCapTableReader*>(&dummyCapTableReader),
      segment->getStartPtr(), options.nestingLimit));
}